

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_circuit.cpp
# Opt level: O2

void __thiscall lsim::ModelCircuit::disconnect_component(ModelCircuit *this,uint32_t id)

{
  __node_base *p_Var1;
  
  p_Var1 = &(this->m_wires)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    ModelWire::remove_component_pins
              (*(ModelWire **)&((_Prime_rehash_policy *)(p_Var1 + 2))->_M_max_load_factor,id);
  }
  return;
}

Assistant:

void ModelCircuit::disconnect_component(uint32_t id) {
    for (auto &pair : m_wires) {
        pair.second->remove_component_pins(id);
    }
}